

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O0

SUNErrCode SUNDataNode_SetDataNvector(SUNDataNode self,N_Vector v,sunrealtype t)

{
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  SUNErrCode err;
  SUNContext_conflict sunctx_local_scope_;
  undefined4 local_4;
  
  if (*(long *)(*in_RDI + 0x68) == 0) {
    local_4 = -0x2701;
  }
  else {
    local_4 = (**(code **)(*in_RDI + 0x68))(in_XMM0_Qa,in_RDI,in_RSI);
  }
  return local_4;
}

Assistant:

SUNErrCode SUNDataNode_SetDataNvector(SUNDataNode self, N_Vector v, sunrealtype t)
{
  SUNFunctionBegin(self->sunctx);

  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  if (self->ops->setdatanvector)
  {
    SUNErrCode err = self->ops->setdatanvector(self, v, t);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }

  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}